

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O3

void * sexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  int iVar1;
  ExpHeader *pEVar2;
  char *src;
  int iVar3;
  long lVar4;
  int_t *piVar5;
  void *pvVar6;
  int iVar7;
  ulong uVar8;
  void *old;
  int iVar9;
  float *dnew;
  int iVar10;
  float fVar11;
  float local_58;
  
  iVar3 = *prev_len;
  iVar10 = (int)((float)iVar3 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar10 = iVar3;
  }
  if (keep_prev != 0) {
    iVar10 = iVar3;
  }
  pEVar2 = Glu->expanders;
  if (Glu->MemModel == SYSTEM) {
    pvVar6 = superlu_malloc((long)iVar10 << 2);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        if (pvVar6 == (void *)0x0) {
          local_58 = 1.5;
          iVar3 = 0xb;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              return (void *)0x0;
            }
            local_58 = (local_58 + 1.0) * 0.5;
            iVar10 = (int)((float)*prev_len * local_58);
            pvVar6 = superlu_malloc((long)iVar10 << 2);
          } while (pvVar6 == (void *)0x0);
        }
      }
      else if (pvVar6 == (void *)0x0) {
        return (void *)0x0;
      }
      old = pEVar2[type].mem;
      if ((type & ~UCOL) == LSUB) {
        copy_mem_int(len_to_copy,old,pvVar6);
        old = pEVar2[type].mem;
      }
      else if (0 < len_to_copy) {
        uVar8 = 0;
        do {
          *(undefined4 *)((long)pvVar6 + uVar8 * 4) = *(undefined4 *)((long)old + uVar8 * 4);
          uVar8 = uVar8 + 1;
        } while ((uint)len_to_copy != uVar8);
      }
      superlu_free(old);
    }
    pEVar2[type].mem = pvVar6;
  }
  else if (Glu->num_expansions == 0) {
    iVar3 = (Glu->stack).used;
    iVar7 = iVar3 + iVar10 * 4;
    if (iVar7 < (Glu->stack).size) {
      iVar3 = (Glu->stack).top1;
      pvVar6 = (void *)((long)iVar3 + (long)(Glu->stack).array);
      (Glu->stack).top1 = iVar10 * 4 + iVar3;
      (Glu->stack).used = iVar7;
      iVar3 = iVar7;
    }
    else {
      pvVar6 = (void *)0x0;
    }
    if ((type < LSUB) && (iVar7 = (int)pvVar6, ((ulong)pvVar6 & 7) != 0)) {
      uVar8 = (long)pvVar6 + 7;
      pvVar6 = (void *)(uVar8 & 0xfffffffffffffff8);
      iVar7 = ((uint)uVar8 & 0xfffffff8) - iVar7;
      piVar5 = &(Glu->stack).top1;
      *piVar5 = *piVar5 + iVar7;
      (Glu->stack).used = iVar3 + iVar7;
    }
    pEVar2[type].mem = pvVar6;
  }
  else {
    iVar9 = (iVar10 - iVar3) * 4;
    iVar7 = (Glu->stack).used;
    if (keep_prev == 0) {
      iVar1 = (Glu->stack).size;
      if (iVar1 <= iVar7 + iVar9) {
        fVar11 = 1.5;
        iVar9 = 0xb;
        do {
          iVar9 = iVar9 + -1;
          if (iVar9 == 0) {
            return (void *)0x0;
          }
          fVar11 = (fVar11 + 1.0) * 0.5;
          iVar10 = (int)(fVar11 * (float)iVar3);
        } while (iVar1 <= iVar7 + (iVar10 - iVar3) * 4);
        iVar9 = (iVar10 - iVar3) * 4;
      }
    }
    else if ((Glu->stack).size <= iVar7 + iVar9) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar2[type + UCOL].mem;
      lVar4 = (long)iVar9;
      user_bcopy(src,src + lVar4,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar5 = (int_t *)((long)pEVar2[3].mem + lVar4);
        pEVar2[3].mem = piVar5;
        Glu->usub = piVar5;
        if (type != LSUB) {
          piVar5 = (int_t *)((long)pEVar2[2].mem + lVar4);
          pEVar2[2].mem = piVar5;
          Glu->lsub = piVar5;
          if (type == LUSUP) {
            pvVar6 = (void *)(lVar4 + (long)pEVar2[1].mem);
            pEVar2[1].mem = pvVar6;
            Glu->ucol = pvVar6;
          }
        }
      }
      iVar3 = (Glu->stack).top1 + iVar9;
      (Glu->stack).top1 = iVar3;
      iVar7 = (Glu->stack).used + iVar9;
      (Glu->stack).used = iVar7;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar3 + iVar9;
        (Glu->stack).used = iVar7 + iVar9;
      }
    }
  }
  pEVar2[type].size = iVar10;
  *prev_len = iVar10;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar2[type].mem;
}

Assistant:

void
*sexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(float);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_float(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = suser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}